

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryReporterPluginTest.cpp
# Opt level: O3

void __thiscall
TEST_MemoryReporterPlugin_whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed_Test::
~TEST_MemoryReporterPlugin_whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed_Test
          (TEST_MemoryReporterPlugin_whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed_Test
           *this)

{
  (this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupMemoryReporterPlugin_002ae9c0;
  StringBufferTestOutput::~StringBufferTestOutput
            (&(this->super_TEST_GROUP_CppUTestGroupMemoryReporterPlugin).output);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST(MemoryReporterPlugin, whenUsingOnlyMallocAllocatorNoOtherOfTheAllocatorsAreUsed)
{
    mock("formatter").expectOneCall("report_test_start").withParameter("result", result).withParameter("test", test);
    mock("formatter").expectOneCall("report_alloc_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getMallocAllocator());
    mock("formatter").expectOneCall("report_free_memory").withParameter("result", result).withParameterOfType("TestMemoryAllocator", "allocator", reporter->getMallocAllocator());
    mock("formatter").ignoreOtherCalls();

    reporter->preTestAction(*test, *result);
    char *memory = getCurrentMallocAllocator()->allocMemoryLeakNode(100);
    getCurrentMallocAllocator()->free_memory(memory, 100, "unknown", 1);
}